

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# artifact.c
# Opt level: O2

void set_artifact_intrinsic(obj *otmp,boolean on,long wp_mask,boolean side_effects)

{
  byte *pbVar1;
  ulong uVar2;
  bool bVar3;
  boolean bVar4;
  char cVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  obj **ppoVar9;
  unsigned_long uVar10;
  uchar uVar11;
  uint uVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  prop *local_50;
  artifact *local_38;
  
  if ((otmp == (obj *)0x0) || ((long)otmp->oartifact == 0)) {
    if (otmp->oprops == 0) {
      return;
    }
    bVar3 = true;
    uVar11 = '\0';
    local_38 = (artifact *)0x0;
LAB_0014a13d:
    bVar14 = false;
    bVar16 = true;
    local_50 = (prop *)0x0;
  }
  else {
    local_38 = artilist + otmp->oartifact;
    uVar11 = (&local_38->defn)[wp_mask == 0x1000].adtyp;
    bVar14 = true;
    switch(uVar11) {
    case '\x01':
      local_50 = u.uprops + 0x2c;
      uVar11 = '\x01';
      break;
    case '\x02':
      local_50 = u.uprops + 1;
      break;
    case '\x03':
      local_50 = u.uprops + 2;
      uVar11 = '\x03';
      break;
    default:
      bVar3 = false;
      goto LAB_0014a13d;
    case '\x05':
      local_50 = u.uprops + 4;
      uVar11 = '\x05';
      break;
    case '\x06':
      local_50 = u.uprops + 5;
      uVar11 = '\x06';
      break;
    case '\a':
      local_50 = u.uprops + 6;
      uVar11 = '\a';
    }
    bVar3 = false;
    bVar16 = false;
  }
  uVar12 = (uint)wp_mask;
  if (((on == '\0') && (wp_mask == 0x1000)) && (bVar14)) {
    ppoVar9 = &invent;
    do {
      ppoVar9 = &((obj *)ppoVar9)->nobj->nobj;
      if ((obj *)ppoVar9 == (obj *)0x0) goto LAB_0014a212;
    } while ((((obj *)ppoVar9 == otmp) || ((long)((obj *)ppoVar9)->oartifact == 0)) ||
            ((uVar11 != artilist[((obj *)ppoVar9)->oartifact].cary.adtyp &&
             ((uVar11 != '\x01' || (bVar4 = is_quest_artifact((obj *)ppoVar9), bVar4 == '\0'))))));
  }
  else {
LAB_0014a212:
    if (!bVar16) {
      uVar6 = ~uVar12 & local_50->extrinsic;
      if (on != '\0') {
        uVar6 = local_50->extrinsic | uVar12;
      }
      local_50->extrinsic = uVar6;
    }
  }
  bVar4 = is_quest_artifact(otmp);
  if ((wp_mask == 0x1000) && (bVar4 != '\0')) {
    if (on == '\0') {
      ppoVar9 = &invent;
      do {
        ppoVar9 = &((obj *)ppoVar9)->nobj->nobj;
        if ((obj *)ppoVar9 == (obj *)0x0) {
          u.uprops[0x2c].extrinsic = u.uprops[0x2c].extrinsic & 0xffffefff;
          break;
        }
      } while ((((obj *)ppoVar9 == otmp) || ((long)((obj *)ppoVar9)->oartifact == 0)) ||
              (artilist[((obj *)ppoVar9)->oartifact].cary.adtyp != '\x01'));
    }
    else {
      u.uprops[0x2c].extrinsic = u.uprops[0x2c].extrinsic | 0x1000;
    }
  }
  if (bVar3) {
    if ((wp_mask != 0x100) && ((wp_mask != 0x400 || ((on != '\0' && (u.twoweap == '\0')))))) {
LAB_0014a35c:
      uVar10 = 0;
      goto LAB_0014a35f;
    }
    if (otmp->oclass != '\x02') {
      if ((otmp->oclass == '\x06') && (cVar5 = objects[otmp->otyp].oc_subtyp, cVar5 != '\0'))
      goto LAB_0014a352;
      goto LAB_0014a35c;
    }
    cVar5 = objects[otmp->otyp].oc_subtyp;
    if ((byte)(cVar5 + 0x18U) < 3) goto LAB_0014a35c;
LAB_0014a352:
    if ((byte)(cVar5 + 0x1bU) < 3) goto LAB_0014a35c;
    uVar2 = otmp->oprops;
    uVar6 = (uint)uVar2;
    uVar10 = (unsigned_long)
             ((uint)(uVar2 >> 8) & 0x20 |
             (uint)(uVar2 >> 3) & 0x200 | (uVar6 & 0x10) * 0x400000 + (uVar6 & 0x400) * 4);
    bVar13 = (uVar6 >> 0x13 & 1) == 0;
    bVar14 = (uVar6 >> 0xe & 1) == 0;
    bVar16 = -1 < (short)uVar2;
    bVar15 = (uVar6 >> 0x12 & 1) == 0;
  }
  else {
    uVar10 = (&local_38->spfx)[wp_mask == 0x1000];
LAB_0014a35f:
    bVar14 = true;
    bVar16 = true;
    bVar15 = true;
    bVar13 = true;
  }
  if (((on == '\0') && (wp_mask == 0x1000)) && (uVar10 != 0)) {
    ppoVar9 = &invent;
    while (ppoVar9 = &((obj *)ppoVar9)->nobj->nobj, (obj *)ppoVar9 != (obj *)0x0) {
      if (((obj *)ppoVar9 != otmp) && ((long)((obj *)ppoVar9)->oartifact != 0)) {
        uVar10 = uVar10 & ~artilist[((obj *)ppoVar9)->oartifact].cspfx;
      }
    }
  }
  uVar6 = (uint)uVar10;
  if ((uVar6 >> 9 & 1) != 0) {
    uVar8 = u.uprops[0xb].extrinsic | uVar12;
    u.uprops[0xb].extrinsic = ~uVar12 & u.uprops[0xb].extrinsic;
    if (on != '\0') {
      u.uprops[0xb].extrinsic = uVar8;
    }
  }
  if ((uVar6 >> 0xb & 1) != 0) {
    make_hallucinated((ulong)(on == '\0'),side_effects,wp_mask);
  }
  if ((uVar6 >> 0xc & 1) != 0) {
    uVar8 = ~uVar12 & u.uprops[0x19].extrinsic;
    u.uprops[0x19].extrinsic = u.uprops[0x19].extrinsic | uVar12;
    if (on == '\0') {
      u.uprops[0x19].extrinsic = uVar8;
    }
    see_monsters();
  }
  if (bVar14) {
LAB_0014a433:
    if (!bVar16) {
      if (on == '\0') {
        u.uprops[0x25].extrinsic = u.uprops[0x25].extrinsic & ~uVar12;
        if (u.uprops[0x25].extrinsic == 0) {
          u.uprops[0x25].extrinsic = 0;
          u.uprops[0x25].intrinsic = 0;
        }
      }
      else {
LAB_0014a4c9:
        if ((u.uprops[0x25].extrinsic == 0) && (u.uprops[0x25].intrinsic < 0x1000000)) {
          uVar8 = rnd(0x14);
          incr_itimeout(&u.uprops[0x25].intrinsic,(ulong)uVar8);
        }
        u.uprops[0x25].extrinsic = uVar12 | u.uprops[0x25].extrinsic;
      }
    }
  }
  else {
    if (on == '\0') {
      u.uprops[0x13].extrinsic = ~uVar12 & u.uprops[0x13].extrinsic;
      if (((side_effects != '\0') && (u.uprops[0x13].extrinsic == 0)) &&
         ((u.uprops[0x13].intrinsic == 0 &&
          ((u.uprops[0x13].blocked == 0 &&
           (pline("You sure are noisy."), (otmp->oprops & 0x4000) != 0)))))) {
        pbVar1 = (byte *)((long)&otmp->oprops_known + 1);
        *pbVar1 = *pbVar1 | 0x40;
      }
      goto LAB_0014a433;
    }
    if ((((side_effects != '\0') && (u.uprops[0x13].extrinsic == 0)) &&
        (u.uprops[0x13].intrinsic == 0)) &&
       ((u.uprops[0x13].blocked == 0 &&
        (pline("You move very quietly."), (otmp->oprops & 0x4000) != 0)))) {
      pbVar1 = (byte *)((long)&otmp->oprops_known + 1);
      *pbVar1 = *pbVar1 | 0x40;
    }
    u.uprops[0x13].extrinsic = u.uprops[0x13].extrinsic | uVar12;
    if (!bVar16) goto LAB_0014a4c9;
  }
  if (bVar15) {
    if (!bVar13) {
      if (on == '\0') {
LAB_0014a5eb:
        u.uprops[0x14].extrinsic = ~uVar12 & u.uprops[0x14].extrinsic;
      }
      else {
LAB_0014a55c:
        u.uprops[0x14].extrinsic = uVar12 | u.uprops[0x14].extrinsic;
      }
    }
  }
  else if (on == '\0') {
    u.uprops[0x28].extrinsic = u.uprops[0x28].extrinsic & ~uVar12;
    if (!bVar13) goto LAB_0014a5eb;
  }
  else {
    u.uprops[0x28].extrinsic = u.uprops[0x28].extrinsic | uVar12;
    if (!bVar13) goto LAB_0014a55c;
  }
  if ((uVar6 >> 0xd & 1) == 0) {
    if ((uVar6 >> 0xe & 1) != 0) {
      if (on == '\0') {
LAB_0014a667:
        u.uprops[10].extrinsic = ~uVar12 & u.uprops[10].extrinsic;
      }
      else {
LAB_0014a641:
        u.uprops[10].extrinsic = uVar12 | u.uprops[10].extrinsic;
      }
    }
  }
  else if (on == '\0') {
    u.uprops[0x2d].extrinsic = u.uprops[0x2d].extrinsic & ~uVar12;
    if ((uVar6 >> 0xe & 1) != 0) goto LAB_0014a667;
  }
  else {
    u.uprops[0x2d].extrinsic = u.uprops[0x2d].extrinsic | uVar12;
    if ((uVar6 >> 0xe & 1) != 0) goto LAB_0014a641;
  }
  if ((uVar6 >> 0x12 & 1) != 0) {
    uVar8 = u.uprops[0xf].extrinsic | uVar12;
    u.uprops[0xf].extrinsic = ~uVar12 & u.uprops[0xf].extrinsic;
    if (on != '\0') {
      u.uprops[0xf].extrinsic = uVar8;
    }
  }
  if ((uVar10 & 0x20) != 0) {
    lVar7 = spec_m2(otmp);
    if (lVar7 == 0) {
      if (on == '\0') {
        u.uprops[0x18].extrinsic = u.uprops[0x18].extrinsic & ~uVar12;
      }
      else {
        u.uprops[0x18].extrinsic = u.uprops[0x18].extrinsic | uVar12;
      }
    }
    else if (on == '\0') {
      u.uprops[0x41].extrinsic = u.uprops[0x41].extrinsic & ~uVar12;
      lVar7 = spec_m2(otmp);
      flags.warntype = flags.warntype & ~(uint)lVar7;
    }
    else {
      u.uprops[0x41].extrinsic = u.uprops[0x41].extrinsic | uVar12;
      lVar7 = spec_m2(otmp);
      flags.warntype = flags.warntype | (uint)lVar7;
    }
    see_monsters();
  }
  if ((uVar6 >> 0x1b & 1) != 0) {
    if (local_38->mtype == 0) {
      if (on == '\0') {
        u.uprops[0x18].extrinsic = u.uprops[0x18].extrinsic & ~uVar12;
      }
      else {
        u.uprops[0x18].extrinsic = u.uprops[0x18].extrinsic | uVar12;
      }
    }
    else if (on == '\0') {
      u.uprops[0x41].extrinsic = u.uprops[0x41].extrinsic & ~uVar12;
    }
    else {
      u.uprops[0x41].extrinsic = u.uprops[0x41].extrinsic | uVar12;
    }
    see_monsters();
  }
  if ((short)uVar10 < 0) {
    if (on != '\0') {
      u.uprops[0x30].extrinsic = u.uprops[0x30].extrinsic | uVar12;
      if ((uVar6 >> 0x10 & 1) == 0) goto LAB_0014a815;
LAB_0014a7d5:
      u.uprops[0x32].extrinsic = uVar12 | u.uprops[0x32].extrinsic;
      goto LAB_0014a815;
    }
    u.uprops[0x30].extrinsic = u.uprops[0x30].extrinsic & ~uVar12;
    if ((uVar6 >> 0x10 & 1) == 0) goto LAB_0014a815;
  }
  else {
    if ((uVar6 >> 0x10 & 1) == 0) goto LAB_0014a815;
    if (on != '\0') goto LAB_0014a7d5;
  }
  u.uprops[0x32].extrinsic = ~uVar12 & u.uprops[0x32].extrinsic;
LAB_0014a815:
  if ((uVar6 >> 0x11 & 1) != 0) {
    uVar8 = u.uprops[0x33].extrinsic | uVar12;
    u.uprops[0x33].extrinsic = ~uVar12 & u.uprops[0x33].extrinsic;
    if (on != '\0') {
      u.uprops[0x33].extrinsic = uVar8;
    }
  }
  if ((uVar6 >> 0x19 & 1) != 0) {
    u.xray_range = -(uint)(on == '\0') | 3;
    vision_full_recalc = '\x01';
  }
  if (((wp_mask & 0x500U) != 0) && ((uVar10 & 0x4000000) != 0)) {
    if (on != '\0') {
      u.uprops[0x2a].extrinsic = u.uprops[0x2a].extrinsic | uVar12;
      return;
    }
    u.uprops[0x2a].extrinsic = u.uprops[0x2a].extrinsic & ~uVar12;
  }
  if ((((wp_mask == 0x1000 && on == '\0') && !bVar3) && ((byte)(local_38->inv_prop - 1) < 0x42)) &&
     ((u.uprops[local_38->inv_prop].extrinsic & 0x2000) != 0)) {
    arti_invoke(otmp);
    return;
  }
  return;
}

Assistant:

void set_artifact_intrinsic(struct obj *otmp, boolean on, long wp_mask,
			    boolean side_effects)
{
	unsigned int *mask = 0;
	const struct artifact *oart = get_artifact(otmp);
	uchar dtyp;
	long spfx;
	boolean spfx_stlth = FALSE;	/* we ran out of SPFX_* bits, so... */
	boolean spfx_fumbling = FALSE;
	boolean spfx_hunger = FALSE;
	boolean spfx_aggravate = FALSE;

	if (!oart && !otmp->oprops)
	    return;

	/* effects from the defn field */
	if (oart)
	    dtyp = (wp_mask != W_ART) ? oart->defn.adtyp : oart->cary.adtyp;
	else
	    dtyp = 0;

	if (dtyp == AD_FIRE)
	    mask = &EFire_resistance;
	else if (dtyp == AD_COLD)
	    mask = &ECold_resistance;
	else if (dtyp == AD_ELEC)
	    mask = &EShock_resistance;
	else if (dtyp == AD_MAGM)
	    mask = &EAntimagic;
	else if (dtyp == AD_DISN)
	    mask = &EDisint_resistance;
	else if (dtyp == AD_DRST)
	    mask = &EPoison_resistance;

	if (mask && wp_mask == W_ART && !on) {
	    /* find out if some other artifact also confers this intrinsic */
	    /* if so, leave the mask alone */
	    struct obj* obj;
	    for (obj = invent; obj; obj = obj->nobj)
		if (obj != otmp && obj->oartifact) {
		    const struct artifact *art = get_artifact(obj);
		    if (art->cary.adtyp == dtyp ||
			(dtyp == AD_MAGM && is_quest_artifact(obj))) {
			mask = NULL;
			break;
		    }
		}
	}
	if (mask) {
	    if (on) *mask |= wp_mask;
	    else *mask &= ~wp_mask;
	}

	/* quest artifact grants magic resistance when carried by their role */
	if (is_quest_artifact(otmp) && wp_mask == W_ART) {
	    if (on) {
		EAntimagic |= W_ART;
	    } else {
		/* don't take away magic resistance if another artifact grants it */
		struct obj *obj;
		for (obj = invent; obj; obj = obj->nobj) {
		    if (obj != otmp && obj->oartifact) {
			const struct artifact *art = get_artifact(obj);
			if (art->cary.adtyp == AD_MAGM) break;
		    }
		}
		if (!obj) EAntimagic &= ~W_ART;
	    }
	}

	/* intrinsics from the spfx field; there could be more than one */
	spfx = 0;
	if (oart) {
	    spfx = (wp_mask != W_ART) ? oart->spfx : oart->cspfx;
	} else if ((wp_mask == W_WEP ||
		    (wp_mask == W_SWAPWEP && (u.twoweap || !on))) &&
		   (otmp->oclass == WEAPON_CLASS || is_weptool(otmp)) &&
		   !is_ammo(otmp) && !is_missile(otmp)) {
	    if (otmp->oprops & ITEM_REFLECTION)
		spfx |= SPFX_REFLECT;
	    if (otmp->oprops & ITEM_ESP)
		spfx |= SPFX_ESP;
	    if (otmp->oprops & ITEM_SEARCHING)
		spfx |= SPFX_SEARCH;
	    if (otmp->oprops & ITEM_WARNING)
		spfx |= SPFX_WARN;
	    if (otmp->oprops & ITEM_STEALTH)
		spfx_stlth = TRUE;
	    if (otmp->oprops & ITEM_FUMBLING)
		spfx_fumbling = TRUE;
	    if (otmp->oprops & ITEM_HUNGER)
		spfx_hunger = TRUE;
	    if (otmp->oprops & ITEM_AGGRAVATE)
		spfx_aggravate = TRUE;
	}

	if (spfx && wp_mask == W_ART && !on) {
	    /* don't change any spfx also conferred by other artifacts */
	    struct obj* obj;
	    for (obj = invent; obj; obj = obj->nobj)
		if (obj != otmp && obj->oartifact) {
		    const struct artifact *art = get_artifact(obj);
		    spfx &= ~art->cspfx;
		}
	}

	if (spfx & SPFX_SEARCH) {
	    if (on) ESearching |= wp_mask;
	    else ESearching &= ~wp_mask;
	}
	if (spfx & SPFX_HALRES) {
	    /* make_hallucinated must (re)set the mask itself to get
	     * the display right */
	    /* hide message when restoring a game */
	    make_hallucinated((long)!on, side_effects, wp_mask);
	}
	if (spfx & SPFX_ESP) {
	    if (on) ETelepat |= wp_mask;
	    else ETelepat &= ~wp_mask;
	    see_monsters();
	}
	if (spfx_stlth) {
	    if (on) {
		if (side_effects && !EStealth && !HStealth && !BStealth) {
		    pline("You move very quietly.");
		    if (otmp->oprops & ITEM_STEALTH)
			otmp->oprops_known |= ITEM_STEALTH;
		}
		EStealth |= wp_mask;
	    } else {
		EStealth &= ~wp_mask;
		if (side_effects && !EStealth && !HStealth && !BStealth) {
		    pline("You sure are noisy.");
		    if (otmp->oprops & ITEM_STEALTH)
			otmp->oprops_known |= ITEM_STEALTH;
		}
	    }
	}
	if (spfx_fumbling) {
	    if (on) {
		if (!EFumbling && !(HFumbling & ~TIMEOUT))
		    incr_itimeout(&HFumbling, rnd(20));
		EFumbling |= wp_mask;
	    } else {
		EFumbling &= ~wp_mask;
		if (!EFumbling && ~(HFumbling & ~TIMEOUT))
		    HFumbling = EFumbling = 0;
	    }
	}
	if (spfx_hunger) {
	    if (on) EHunger |= wp_mask;
	    else EHunger &= ~wp_mask;
	}
	if (spfx_aggravate) {
	    if (on) EAggravate_monster |= wp_mask;
	    else EAggravate_monster &= ~wp_mask;
	}
	if (spfx & SPFX_DISPL) {
	    if (on) EDisplaced |= wp_mask;
	    else EDisplaced &= ~wp_mask;
	}
	if (spfx & SPFX_REGEN) {
	    if (on) ERegeneration |= wp_mask;
	    else ERegeneration &= ~wp_mask;
	}
	if (spfx & SPFX_TCTRL) {
	    if (on) ETeleport_control |= wp_mask;
	    else ETeleport_control &= ~wp_mask;
	}
	if (spfx & SPFX_WARN) {
	    if (spec_m2(otmp)) {
		if (on) {
			EWarn_of_mon |= wp_mask;
			flags.warntype |= spec_m2(otmp);
		} else {
			EWarn_of_mon &= ~wp_mask;
			flags.warntype &= ~spec_m2(otmp);
		}
	    } else {
		if (on) EWarning |= wp_mask;
		else EWarning &= ~wp_mask;
	    }
	    see_monsters();
	}
	if (spfx & SPFX_WARN_S) {
	    if (oart->mtype) {
		if (on) {
		    EWarn_of_mon |= wp_mask;
		} else {
		    EWarn_of_mon &= ~wp_mask;
		}
	    } else {
		if (on) EWarning |= wp_mask;
	    	else EWarning &= ~wp_mask;
	    }
	    see_monsters();
	}
	if (spfx & SPFX_EREGEN) {
	    if (on) EEnergy_regeneration |= wp_mask;
	    else EEnergy_regeneration &= ~wp_mask;
	}
	if (spfx & SPFX_HSPDAM) {
	    if (on) EHalf_spell_damage |= wp_mask;
	    else EHalf_spell_damage &= ~wp_mask;
	}
	if (spfx & SPFX_HPHDAM) {
	    if (on) EHalf_physical_damage |= wp_mask;
	    else EHalf_physical_damage &= ~wp_mask;
	}
	if (spfx & SPFX_XRAY) {
	    /* this assumes that no one else is using xray_range */
	    if (on) u.xray_range = 3;
	    else u.xray_range = -1;
	    vision_full_recalc = 1;
	}
	if ((spfx & SPFX_REFLECT) && (wp_mask & (W_WEP|W_SWAPWEP))) {
	    if (on) EReflecting |= wp_mask;
	    else EReflecting &= ~wp_mask;
	}

	if (wp_mask == W_ART && !on && oart && oart->inv_prop) {
	    /* might have to turn off invoked power too */
	    if (oart->inv_prop <= LAST_PROP &&
		(u.uprops[oart->inv_prop].extrinsic & W_ARTI))
		arti_invoke(otmp);
	}
}